

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

ImfHeader * ImfNewHeader(void)

{
  Header *this;
  V2f local_20;
  
  this = (Header *)operator_new(0x38);
  local_20.x = 0.0;
  local_20.y = 0.0;
  Imf_3_4::Header::Header(this,0x40,0x40,1.0,&local_20,1.0,INCREASING_Y,ZIP_COMPRESSION);
  return (ImfHeader *)this;
}

Assistant:

ImfHeader*
ImfNewHeader (void)
{
    try
    {
        return (ImfHeader*) new OPENEXR_IMF_INTERNAL_NAMESPACE::Header;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}